

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters
          (NetworkUpdateParameters *this,NetworkUpdateParameters *from)

{
  bool bVar1;
  Optimizer *this_00;
  BoolParameter *this_01;
  Int64Parameter *pIVar2;
  NetworkUpdateParameters *from_local;
  NetworkUpdateParameters *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NetworkUpdateParameters_006f8348
  ;
  google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::RepeatedPtrField
            (&this->losslayers_,&from->losslayers_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_optimizer(from);
  if (bVar1) {
    this_00 = (Optimizer *)operator_new(0x20);
    Optimizer::Optimizer(this_00,from->optimizer_);
    this->optimizer_ = this_00;
  }
  else {
    this->optimizer_ = (Optimizer *)0x0;
  }
  bVar1 = _internal_has_epochs(from);
  if (bVar1) {
    pIVar2 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar2,from->epochs_);
    this->epochs_ = pIVar2;
  }
  else {
    this->epochs_ = (Int64Parameter *)0x0;
  }
  bVar1 = _internal_has_shuffle(from);
  if (bVar1) {
    this_01 = (BoolParameter *)operator_new(0x18);
    BoolParameter::BoolParameter(this_01,from->shuffle_);
    this->shuffle_ = this_01;
  }
  else {
    this->shuffle_ = (BoolParameter *)0x0;
  }
  bVar1 = _internal_has_seed(from);
  if (bVar1) {
    pIVar2 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(pIVar2,from->seed_);
    this->seed_ = pIVar2;
  }
  else {
    this->seed_ = (Int64Parameter *)0x0;
  }
  return;
}

Assistant:

NetworkUpdateParameters::NetworkUpdateParameters(const NetworkUpdateParameters& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      losslayers_(from.losslayers_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_optimizer()) {
    optimizer_ = new ::CoreML::Specification::Optimizer(*from.optimizer_);
  } else {
    optimizer_ = nullptr;
  }
  if (from._internal_has_epochs()) {
    epochs_ = new ::CoreML::Specification::Int64Parameter(*from.epochs_);
  } else {
    epochs_ = nullptr;
  }
  if (from._internal_has_shuffle()) {
    shuffle_ = new ::CoreML::Specification::BoolParameter(*from.shuffle_);
  } else {
    shuffle_ = nullptr;
  }
  if (from._internal_has_seed()) {
    seed_ = new ::CoreML::Specification::Int64Parameter(*from.seed_);
  } else {
    seed_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NetworkUpdateParameters)
}